

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MmlCompiler.cpp
# Opt level: O2

optional<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
 (anonymous_namespace)::isStartsWith<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
           (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *iBegin,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *iEnd,string *s)

{
  char *__first1;
  _Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  _Var1;
  undefined7 extraout_var;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  optional<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oVar3;
  
  _Var1 = (_Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
           )((long)iEnd->_M_current - (long)iBegin->_M_current);
  if (s->_M_string_length <= (ulong)_Var1) {
    __first1 = (s->_M_dataplus)._M_p;
    _Var1._0_1_ = std::__equal<true>::equal<char>
                            (__first1,__first1 + s->_M_string_length,iBegin->_M_current);
    _Var1._1_7_ = extraout_var;
    if (_Var1._0_1_) {
      _Var1 = (_Storage<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
               )((long)iBegin->_M_current + s->_M_string_length);
      uVar2 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      goto LAB_0012ca38;
    }
  }
  uVar2 = 0;
LAB_0012ca38:
  oVar3.
  super__Optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._8_8_ = uVar2;
  oVar3.
  super__Optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_payload = _Var1;
  return (optional<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )oVar3.
           super__Optional_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           ._M_payload.
           super__Optional_payload_base<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
}

Assistant:

std::optional<T> isStartsWith(const T& iBegin, const T& iEnd, const std::string& s) {
	if (static_cast<size_t>(iEnd - iBegin) >= s.size() && std::equal(s.cbegin(), s.cend(), iBegin)) {
		return iBegin + s.size();
	}
	return std::nullopt;
}